

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOManager.cpp
# Opt level: O0

Mat * IOManager::secret_share_ngram(int *data,int size,string *prefix)

{
  undefined1 v [16];
  ostream *poVar1;
  void *pvVar2;
  undefined8 *puVar3;
  reference pvVar4;
  ll lVar5;
  reference pvVar6;
  Mat *pMVar7;
  string *in_RDX;
  int in_ESI;
  long in_RDI;
  ll tmp;
  int k;
  int j_1;
  int i_1;
  int j;
  string filename;
  int i;
  Mat *res;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  out_files;
  vector<long_long,_std::allocator<long_long>_> coefficients;
  Mat *in_stack_fffffffffffffdf0;
  undefined1 *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  size_type in_stack_fffffffffffffe08;
  vector<long_long,_std::allocator<long_long>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  ostream *in_stack_fffffffffffffe40;
  Mat *local_198;
  undefined1 local_148 [24];
  longlong local_130;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [36];
  int local_74;
  Mat *local_70;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  local_60 [2];
  vector<long_long,_std::allocator<long_long>_> local_30;
  int local_c;
  long local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  std::allocator<long_long>::allocator((allocator<long_long> *)0x136c8b);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
             (allocator_type *)in_stack_fffffffffffffe00);
  std::allocator<long_long>::~allocator((allocator<long_long> *)0x136cb4);
  std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>::allocator
            ((allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x136cc9);
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
           (allocator_type *)in_stack_fffffffffffffe00);
  std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>::~allocator
            ((allocator<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x136cf2);
  poVar1 = std::operator<<((ostream *)&std::cout,in_RDX);
  poVar1 = std::operator<<(poVar1," size: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_c);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  puVar3 = (undefined8 *)operator_new__(0x80);
  *puVar3 = 3;
  local_70 = (Mat *)(puVar3 + 1);
  local_198 = local_70;
  do {
    Mat::Mat(in_stack_fffffffffffffdf0);
    local_198 = local_198 + 1;
  } while (local_198 != (Mat *)(puVar3 + 0x10));
  for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
    Mat::init(local_70 + local_74,(EVP_PKEY_CTX *)0x1);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   in_stack_fffffffffffffe30);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    std::__cxx11::to_string(in_stack_fffffffffffffe3c);
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::operator+(in_stack_fffffffffffffdf8,(char *)in_stack_fffffffffffffdf0);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    poVar1 = std::operator<<((ostream *)&std::cout,"File: ");
    in_stack_fffffffffffffe40 = std::operator<<(poVar1,local_98);
    std::ostream::operator<<(in_stack_fffffffffffffe40,std::endl<char,std::char_traits<char>>);
    pvVar4 = std::
             vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             ::operator[](local_60,(long)local_74);
    std::ofstream::open((string *)pvVar4,(_Ios_Openmode)local_98);
    std::__cxx11::string::~string(local_98);
  }
  for (local_11c = 1; local_11c < 2; local_11c = local_11c + 1) {
    lVar5 = Constant::Util::randomlong();
    pvVar6 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                       (&local_30,(long)local_11c);
    *pvVar6 = lVar5;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Size: ");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,local_c);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  for (local_120 = 0; pMVar7 = local_70, local_120 < local_c; local_120 = local_120 + 1) {
    for (local_124 = 1; local_124 < 2; local_124 = local_124 + 1) {
      in_stack_fffffffffffffe10 =
           (vector<long_long,_std::allocator<long_long>_> *)Constant::Util::randomlong();
      pvVar6 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&local_30,(long)local_124);
      *pvVar6 = (value_type)in_stack_fffffffffffffe10;
    }
    pMVar7 = (Mat *)(long)(*(int *)(local_8 + (long)local_120 * 4) << 0x14);
    pvVar6 = std::vector<long_long,_std::allocator<long_long>_>::operator[](&local_30,0);
    *pvVar6 = (value_type)pMVar7;
    for (local_128 = 0; local_128 < 3; local_128 = local_128 + 1) {
      std::vector<long_long,_std::allocator<long_long>_>::vector
                ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe40,
                 (vector<long_long,_std::allocator<long_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      puVar8 = local_148;
      lVar5 = poly_eval(in_stack_fffffffffffffe10,(ll)pMVar7);
      std::vector<long_long,_std::allocator<long_long>_>::~vector
                ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe00);
      local_130 = lVar5;
      pvVar4 = std::
               vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               ::operator[](local_60,(long)local_128);
      in_stack_fffffffffffffe00 = (ostream *)std::ostream::operator<<(pvVar4,local_130);
      std::operator<<(in_stack_fffffffffffffe00,",");
      v._8_8_ = lVar5;
      v._0_8_ = puVar8;
      Mat::setVal(pMVar7,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20),(ll128)v);
    }
  }
  std::
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             *)in_stack_fffffffffffffe00);
  std::vector<long_long,_std::allocator<long_long>_>::~vector
            ((vector<long_long,_std::allocator<long_long>_> *)in_stack_fffffffffffffe00);
  return pMVar7;
}

Assistant:

Mat* IOManager::secret_share_ngram(int* data, int size, string prefix) {
    vector<ll> coefficients(TN);
    vector<ofstream> out_files(M);
    cout << prefix << " size: " << size << endl;

    Mat* res = new Mat[M];
//    Mat res(1, size);
    for (int i = 0; i < M; ++i) {
        res[i].init(1, size);
        string filename = "output/"+prefix+"_"+to_string(i)+".csv";
        cout << "File: " << filename << endl;
        out_files[i].open(filename, ios::out);
    }
    /// 简化计算，TODO，delete
    for (int j = 1; j < TN; ++j) {
        coefficients[j] = Constant::Util::randomlong();
    }
//    for (int j = 0; j < TN; ++j) {
//        cout << j << ": " << coefficients[j] << endl;
//    }
    cout << "Size: " << size << endl;
//    srand(time(0));
    for (int i = 0; i < size; ++i) {
        for (int j = 1; j < TN; ++j) {
            coefficients[j] = Constant::Util::randomlong();
        }
        coefficients[0] = data[i]*IE;
        for (int k = 0; k < M; ++k) {
            ll tmp = poly_eval(coefficients, k + 2);
            out_files[k] << tmp << ",";
            res[k].setVal(i, tmp);
//            if(k==node_type){
//                res.setVal(i, tmp);
//            }
        }
//        for (int l = 0; l < TN; ++l) {
//            DBGprint("%lld, ", coefficients[l]);
//        }
//        cout << endl;
    }
//    res[0].print();
    return res;
}